

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O3

void __thiscall wabt::WriteUint128(wabt *this,char *buffer,size_t size,v128 bits)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  wabt *pwVar10;
  long lVar11;
  char reversed_buffer [40];
  char remainder_buffer [21];
  v128 local_98;
  char *local_88;
  undefined8 local_80;
  char local_78 [48];
  char local_48 [24];
  
  local_98.v._8_8_ = bits.v._0_8_;
  pcVar6 = (char *)0x0;
  local_98.v._0_8_ = size;
  local_88 = buffer;
  local_80 = this;
  while( true ) {
    uVar9 = (ulong)local_98.v._8_8_ >> 0x20;
    lVar11 = 3;
    do {
      lVar1 = lVar11 + -1;
      uVar3 = v128::To<unsigned_int>(&local_98,(int)lVar1);
      iVar2 = (int)(uVar9 / 10);
      uVar9 = CONCAT44((int)uVar9 + iVar2 * -10,uVar3);
      *(int *)(local_98.v + lVar11 * 4) = iVar2;
      lVar11 = lVar1;
    } while (lVar1 != 0);
    local_98.v._0_4_ = (int)(uVar9 / 10);
    snprintf(local_48,0x15,"%lu");
    sVar4 = strlen(local_48);
    pcVar8 = pcVar6 + (int)sVar4;
    if ((char *)0x27 < pcVar8) break;
    memcpy(local_78 + (long)pcVar6,local_48,(long)(int)sVar4);
    ppcVar5 = (char **)std::
                       __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<v128::is_zero()const::_lambda(unsigned_char)_1_>>
                                 (&local_98,&local_88);
    pcVar6 = pcVar8;
    if (ppcVar5 == &local_88) {
      pcVar6 = local_88 + -1;
      if (pcVar8 < local_88) {
        pcVar6 = pcVar8;
      }
      pcVar7 = (char *)0x0;
      if (pcVar8 >= local_88) {
        pcVar7 = pcVar8 + (1 - (long)local_88);
      }
      if (pcVar6 != (char *)0x0) {
        pcVar8 = pcVar6;
        pwVar10 = local_80;
        do {
          *pwVar10 = *(wabt *)(pcVar8 + (long)(local_78 + (long)(pcVar7 + -1)));
          pwVar10 = pwVar10 + 1;
          pcVar8 = pcVar8 + -1;
        } while (pcVar8 != (char *)0x0);
      }
      local_80[(long)pcVar6] = (wabt)0x0;
      return;
    }
  }
  __assert_fail("len + remainder_buffer_len < sizeof(reversed_buffer)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                ,0x32f,"void wabt::WriteUint128(char *, size_t, v128)");
}

Assistant:

void WriteUint128(char* buffer, size_t size, v128 bits) {
  uint64_t digits;
  uint64_t remainder;
  char reversed_buffer[40];
  size_t len = 0;
  do {
    remainder = bits.u32(3);

    for (int i = 3; i != 0; --i) {
      digits = remainder / 10;
      remainder = ((remainder - digits * 10) << 32) + bits.u32(i - 1);
      bits.set_u32(i, digits);
    }

    digits = remainder / 10;
    remainder = remainder - digits * 10;
    bits.set_u32(0, digits);

    char remainder_buffer[21];
    snprintf(remainder_buffer, 21, "%" PRIu64, remainder);
    int remainder_buffer_len = strlen(remainder_buffer);
    assert(len + remainder_buffer_len < sizeof(reversed_buffer));
    memcpy(&reversed_buffer[len], remainder_buffer, remainder_buffer_len);
    len += remainder_buffer_len;
  } while (!bits.is_zero());
  size_t truncated_tail = 0;
  if (len >= size) {
    truncated_tail = len - size + 1;
    len = size - 1;
  }
  std::reverse_copy(reversed_buffer + truncated_tail,
                    reversed_buffer + len + truncated_tail, buffer);
  buffer[len] = '\0';
}